

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O1

void exe_get_tpl(voccxdef *ctx,objnum verb,uint *tplofs,uint *actofs)

{
  uint uVar1;
  
  uVar1 = objgetap(ctx->voccxmem,verb,0x2e,(objnum *)0x0,0);
  *tplofs = uVar1;
  if (uVar1 == 0) {
    uVar1 = objgetap(ctx->voccxmem,verb,0x12,(objnum *)0x0,0);
    *tplofs = uVar1;
  }
  uVar1 = objgetap(ctx->voccxmem,verb,0x1f,(objnum *)0x0,0);
  *actofs = uVar1;
  return;
}

Assistant:

static void exe_get_tpl(voccxdef *ctx, objnum verb,
                        uint *tplofs, uint *actofs)
{
    /* look up the new-style template first */
    *tplofs = objgetap(ctx->voccxmem, verb, PRP_TPL2, (objnum *)0, FALSE);

    /* if there's no new-style template, look up the old-style template */
    if (*tplofs == 0)
        *tplofs = objgetap(ctx->voccxmem, verb, PRP_TPL, (objnum *)0, FALSE);

    /* also look to see if the verb has an Action method */
    *actofs = objgetap(ctx->voccxmem, verb, PRP_ACTION, (objnum *)0, FALSE);
}